

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void stbtt__h_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uchar buffer [8];
  byte local_50 [8];
  ulong local_48;
  int local_3c;
  long local_38;
  
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  local_50[5] = 0;
  local_50[6] = 0;
  local_50[7] = 0;
  if (0 < h) {
    local_48 = (ulong)(w - kernel_width);
    local_38 = (long)stride_in_bytes;
    uVar5 = (ulong)((w - kernel_width) + 1);
    iVar7 = 0;
    local_3c = h;
    do {
      memset(local_50,0,(ulong)kernel_width);
      switch(kernel_width) {
      case 2:
        if ((int)local_48 < 0) {
LAB_00111854:
          uVar6 = 0;
          uVar3 = 0;
        }
        else {
          uVar6 = 0;
          uVar3 = 0;
          do {
            bVar1 = pixels[uVar6];
            bVar2 = local_50[(uint)uVar6 & 7];
            local_50[(uint)uVar6 + 2 & 7] = bVar1;
            uVar3 = uVar3 + ((uint)bVar1 - (uint)bVar2);
            pixels[uVar6] = (uchar)(uVar3 >> 1);
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        break;
      case 3:
        if ((int)local_48 < 0) goto LAB_00111854;
        uVar6 = 0;
        uVar3 = 0;
        do {
          bVar1 = pixels[uVar6];
          bVar2 = local_50[(uint)uVar6 & 7];
          local_50[(uint)uVar6 + 3 & 7] = bVar1;
          uVar3 = uVar3 + ((uint)bVar1 - (uint)bVar2);
          pixels[uVar6] = (uchar)(uVar3 / 3);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        break;
      case 4:
        if ((int)local_48 < 0) goto LAB_00111854;
        uVar6 = 0;
        uVar3 = 0;
        do {
          bVar1 = pixels[uVar6];
          uVar4 = (ulong)((uint)uVar6 & 7);
          local_50[uVar4 ^ 4] = bVar1;
          uVar3 = uVar3 + ((uint)bVar1 - (uint)local_50[uVar4]);
          pixels[uVar6] = (uchar)(uVar3 >> 2);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        break;
      case 5:
        if ((int)local_48 < 0) goto LAB_00111854;
        uVar6 = 0;
        uVar3 = 0;
        do {
          bVar1 = pixels[uVar6];
          bVar2 = local_50[(uint)uVar6 & 7];
          local_50[(uint)uVar6 + 5 & 7] = bVar1;
          uVar3 = uVar3 + ((uint)bVar1 - (uint)bVar2);
          pixels[uVar6] = (uchar)(uVar3 / 5);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        break;
      default:
        if ((int)local_48 < 0) {
          uVar6 = 0;
          uVar3 = 0;
        }
        else {
          uVar6 = 0;
          uVar3 = 0;
          do {
            bVar1 = pixels[uVar6];
            bVar2 = local_50[(uint)uVar6 & 7];
            local_50[kernel_width + (uint)uVar6 & 7] = bVar1;
            uVar3 = uVar3 + ((uint)bVar1 - (uint)bVar2);
            pixels[uVar6] = (uchar)(uVar3 / kernel_width);
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
      }
      if ((int)uVar6 < w) {
        uVar6 = uVar6 & 0xffffffff;
        do {
          uVar3 = uVar3 - local_50[(uint)uVar6 & 7];
          pixels[uVar6] = (uchar)(uVar3 / kernel_width);
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < w);
      }
      pixels = pixels + local_38;
      iVar7 = iVar7 + 1;
    } while (iVar7 != local_3c);
  }
  return;
}

Assistant:

static void stbtt__h_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
unsigned char buffer[STBTT_MAX_OVERSAMPLE];
int safe_w = w - kernel_width;
int j;
STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); /*  suppress bogus warning from VS2013 -analyze */
for (j=0; j < h; ++j) {
int i;
unsigned int total;
STBTT_memset(buffer, 0, kernel_width);

total = 0;

/*  make kernel_width a constant in common cases so compiler can optimize out the divide */
switch (kernel_width) {
case 2:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 2);
}
break;
case 3:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 3);
}
break;
case 4:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 4);
}
break;
case 5:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 5);
}
break;
default:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / kernel_width);
}
break;
}

for (; i < w; ++i) {
STBTT_assert(pixels[i] == 0);
total -= buffer[i & STBTT__OVER_MASK];
pixels[i] = (unsigned char) (total / kernel_width);
}

pixels += stride_in_bytes;
}
}